

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

void __thiscall QMainWindow::setDockNestingEnabled(QMainWindow *this,bool enabled)

{
  QMainWindowLayout *this_00;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QMainWindowPrivate *d;
  DockOptions opts;
  QFlagsStorage<QMainWindow::DockOption> opts_00;
  long lVar1;
  
  opts_00.i = (Int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMainWindowLayout *)d_func((QMainWindow *)0x5ea15e);
  QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5ea17a);
  QFlags<QMainWindow::DockOption>::setFlag
            ((QFlags<QMainWindow::DockOption> *)d,(DockOption)((ulong)lVar1 >> 0x20),
             SUB81((ulong)lVar1 >> 0x18,0));
  QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5ea1ab);
  QMainWindowLayout::setDockOptions(this_00,(DockOptions)opts_00.i);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindow::setDockNestingEnabled(bool enabled)
{
    Q_D(QMainWindow);

    DockOptions opts = d->layout->dockOptions;
    opts.setFlag(AllowNestedDocks, enabled);

    d->layout->setDockOptions(opts);
}